

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::write_websocket_close(coro_http_client *this,string *msg)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 in_RDX;
  string *in_RSI;
  LazyBase<cinatra::resp_data,_false> in_RDI;
  resp_data *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  LazyPromise<cinatra::resp_data> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int iVar3;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  opcode op;
  string *data;
  Handle this_00;
  
  op = (opcode)((ulong)in_RDX >> 0x38);
  data = in_RSI;
  this_00 = in_RDI._coro.__handle_;
  puVar2 = (undefined8 *)operator_new(0xf0,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = write_websocket_close;
    puVar2[1] = write_websocket_close;
    puVar2[0x1c] = in_RSI;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe38);
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
              (in_stack_fffffffffffffe38);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xed));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xed));
      write_websocket((coro_http_client *)this_00.__handle_,data,op);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 (Lazy<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      bVar1 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                        ((LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x19));
      if (bVar1) {
        puVar2[0x18] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x19);
        async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                  ((LazyAwaiterBase<cinatra::resp_data> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
        return_value<cinatra::resp_data>
                  ((LazyPromise<cinatra::resp_data> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe18);
        iVar3 = 0;
        async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x437ae9);
        async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x437af6);
        if (iVar3 == 0) {
          async_simple::coro::detail::LazyPromiseBase::final_suspend
                    ((LazyPromiseBase *)(puVar2 + 2));
          bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar2 + 0xee));
          if (!bVar1) {
            *puVar2 = 0;
            *(undefined1 *)((long)puVar2 + 0xec) = 2;
            write_websocket_close
                      ((void *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (void *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xee));
          in_stack_fffffffffffffe24 = 0;
          iVar3 = 0;
        }
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
                  ((LazyPromise<cinatra::resp_data> *)0x437c6b);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe24,iVar3));
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0xf0);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0xec) = 1;
        write_websocket_close
                  ((void *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe38);
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0xec) = 0;
      write_websocket_close
                ((void *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (void *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
  }
  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> write_websocket_close(
      std::string msg = "") {
    co_return co_await write_websocket(std::move(msg), opcode::close);
  }